

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Chapters::Edition::Clear(Edition *this)

{
  Atom *pAVar1;
  uint uVar2;
  
  while( true ) {
    pAVar1 = this->m_atoms;
    if (this->m_atoms_count < 1) break;
    uVar2 = this->m_atoms_count - 1;
    this->m_atoms_count = uVar2;
    Atom::Clear(pAVar1 + uVar2);
  }
  if (pAVar1 != (Atom *)0x0) {
    operator_delete__(&pAVar1[-1].m_displays_size);
  }
  this->m_atoms = (Atom *)0x0;
  this->m_atoms_size = 0;
  return;
}

Assistant:

void Chapters::Edition::Clear() {
  while (m_atoms_count > 0) {
    Atom& a = m_atoms[--m_atoms_count];
    a.Clear();
  }

  delete[] m_atoms;
  m_atoms = NULL;

  m_atoms_size = 0;
}